

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O1

int pztopology::TPZTetrahedron::SideDimension(int side)

{
  int iVar1;
  long *plVar2;
  
  if ((uint)side < 0xf) {
    iVar1 = *(int *)(sidedimension + (ulong)(uint)side * 4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZTetrahedron::SideDimension side ",0x23);
    plVar2 = (long *)std::ostream::operator<<(&std::cerr,side);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPZTetrahedron::SideDimension(int side) {
		if(side<0 || side >= NSides) {
			PZError << "TPZTetrahedron::SideDimension side " << side << endl;
			return -1;
		}
		return sidedimension[side];
	}